

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O2

int Ivy_NodeCutDeriveNew(Ivy_Cut_t *pCut,Ivy_Cut_t *pCutNew,int IdOld,int IdNew0,int IdNew1)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  sVar4 = pCut->nSize;
  if ((long)sVar4 < 1) {
    __assert_fail("pCut->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x270,"int Ivy_NodeCutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
  }
  if (IdNew1 <= IdNew0) {
    __assert_fail("IdNew0 < IdNew1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x271,"int Ivy_NodeCutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
  }
  uVar3 = 0;
  iVar5 = 0;
  for (lVar7 = 0; sVar4 != lVar7; lVar7 = lVar7 + 1) {
    iVar6 = pCut->pArray[lVar7];
    if (iVar6 != IdOld) {
      iVar2 = IdNew0;
      if ((IdNew0 <= iVar6) && (iVar2 = 0x7fffffff, IdNew0 < iVar6)) {
        pCutNew->pArray[iVar5] = IdNew0;
        uVar3 = uVar3 | 1 << (IdNew0 % 0x1f & 0x1fU);
        iVar6 = pCut->pArray[lVar7];
        iVar5 = iVar5 + 1;
      }
      iVar8 = IdNew1;
      if ((IdNew1 <= iVar6) && (iVar8 = 0x7fffffff, IdNew1 < iVar6)) {
        lVar1 = (long)iVar5;
        iVar5 = iVar5 + 1;
        pCutNew->pArray[lVar1] = IdNew1;
        uVar3 = uVar3 | 1 << (IdNew1 % 0x1f & 0x1fU);
        iVar6 = pCut->pArray[lVar7];
      }
      lVar1 = (long)iVar5;
      iVar5 = iVar5 + 1;
      pCutNew->pArray[lVar1] = iVar6;
      uVar3 = uVar3 | 1 << (pCut->pArray[lVar7] % 0x1f & 0x1fU);
      IdNew1 = iVar8;
      IdNew0 = iVar2;
    }
  }
  iVar6 = iVar5;
  if (IdNew0 != 0x7fffffff) {
    iVar6 = iVar5 + 1;
    pCutNew->pArray[iVar5] = IdNew0;
    uVar3 = uVar3 | 1 << (IdNew0 % 0x1f & 0x1fU);
  }
  if (IdNew1 != 0x7fffffff) {
    lVar7 = (long)iVar6;
    iVar6 = iVar6 + 1;
    pCutNew->pArray[lVar7] = IdNew1;
    uVar3 = uVar3 | 1 << (IdNew1 % 0x1f & 0x1fU);
  }
  sVar4 = (short)iVar6;
  pCutNew->nSize = sVar4;
  pCutNew->uHash = uVar3;
  if ((int)pCut->nSizeMax < (int)sVar4) {
    __assert_fail("pCutNew->nSize <= pCut->nSizeMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x297,"int Ivy_NodeCutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
  }
  return (int)sVar4;
}

Assistant:

static inline int Ivy_NodeCutDeriveNew( Ivy_Cut_t * pCut, Ivy_Cut_t * pCutNew, int IdOld, int IdNew0, int IdNew1 )
{
    unsigned uHash = 0;
    int i, k; 
    assert( pCut->nSize > 0 );
    assert( IdNew0 < IdNew1 );
    for ( i = k = 0; i < pCut->nSize; i++ )
    {
        if ( pCut->pArray[i] == IdOld )
            continue;
        if ( IdNew0 <= pCut->pArray[i] )
        {
            if ( IdNew0 < pCut->pArray[i] )
            {
                pCutNew->pArray[ k++ ] = IdNew0;
                uHash |= Ivy_NodeCutHashValue( IdNew0 );
            }
            IdNew0 = 0x7FFFFFFF;
        }
        if ( IdNew1 <= pCut->pArray[i] )
        {
            if ( IdNew1 < pCut->pArray[i] )
            {
                pCutNew->pArray[ k++ ] = IdNew1;
                uHash |= Ivy_NodeCutHashValue( IdNew1 );
            }
            IdNew1 = 0x7FFFFFFF;
        }
        pCutNew->pArray[ k++ ] = pCut->pArray[i];
        uHash |= Ivy_NodeCutHashValue( pCut->pArray[i] );
    }
    if ( IdNew0 < 0x7FFFFFFF )
    {
        pCutNew->pArray[ k++ ] = IdNew0;
        uHash |= Ivy_NodeCutHashValue( IdNew0 );
    }
    if ( IdNew1 < 0x7FFFFFFF )
    {
        pCutNew->pArray[ k++ ] = IdNew1;
        uHash |= Ivy_NodeCutHashValue( IdNew1 );
    }
    pCutNew->nSize = k;
    pCutNew->uHash = uHash;
    assert( pCutNew->nSize <= pCut->nSizeMax );
//    for ( i = 1; i < pCutNew->nSize; i++ )
//        assert( pCutNew->pArray[i-1] < pCutNew->pArray[i] );
    return 1;
}